

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int execute_filter_e8(rar_filter *filter,rar_virtual_machine *vm,size_t pos,int e9also)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar1 = filter->initialregisters[4];
  iVar2 = 0;
  if (0xfffc4002 < uVar1 - 0x3c001) {
    uVar5 = 0;
    do {
      if ((vm->memory[uVar5] == 0xe8) || (e9also != 0 && vm->memory[uVar5] == 0xe9)) {
        uVar6 = (int)pos + 1 + uVar5;
        uVar4 = (ulong)(uVar5 + 1);
        uVar3 = *(uint *)(vm->memory + uVar4);
        if (((int)uVar3 < 0) && (-uVar3 <= uVar6)) {
          uVar6 = uVar3 + 0x1000000;
LAB_005645f1:
          vm->memory[uVar4] = (uint8_t)uVar3;
          vm->memory[uVar4 + 1] = (uint8_t)(uVar3 >> 8);
          vm->memory[uVar4 + 2] = (uint8_t)(uVar3 >> 0x10);
          vm->memory[uVar4 + 3] = (uint8_t)(uVar6 >> 0x18);
        }
        else if (uVar3 < 0x1000000) {
          uVar3 = uVar3 - uVar6;
          uVar6 = uVar3;
          goto LAB_005645f1;
        }
        uVar5 = uVar5 + 4;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 <= uVar1 - 5);
    filter->filteredblockaddress = 0;
    filter->filteredblocklength = uVar1;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
execute_filter_e8(struct rar_filter *filter, struct rar_virtual_machine *vm, size_t pos, int e9also)
{
  uint32_t length = filter->initialregisters[4];
  uint32_t filesize = 0x1000000;
  uint32_t i;

  if (length > PROGRAM_WORK_SIZE || length < 4)
    return 0;

  for (i = 0; i <= length - 5; i++)
  {
    if (vm->memory[i] == 0xE8 || (e9also && vm->memory[i] == 0xE9))
    {
      uint32_t currpos = (uint32_t)pos + i + 1;
      int32_t address = (int32_t)vm_read_32(vm, i + 1);
      if (address < 0 && currpos >= (uint32_t)-address)
        vm_write_32(vm, i + 1, address + filesize);
      else if (address >= 0 && (uint32_t)address < filesize)
        vm_write_32(vm, i + 1, address - currpos);
      i += 4;
    }
  }

  filter->filteredblockaddress = 0;
  filter->filteredblocklength = length;

  return 1;
}